

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

Reader * __thiscall
capnp::MessageReader::getRootInternal(Reader *__return_storage_ptr__,MessageReader *this)

{
  uint64_t uVar1;
  SegmentReader *segment;
  PointerReader local_40;
  
  if (this->allocatedArena == false) {
    _::ReaderArena::ReaderArena((ReaderArena *)this->arenaSpace,this);
    this->allocatedArena = true;
  }
  segment = _::ReaderArena::tryGetSegment((ReaderArena *)this->arenaSpace,(SegmentId)0x0);
  if ((segment != (SegmentReader *)0x0) && ((segment->ptr).size_ != 0)) {
    uVar1 = segment->readLimiter->limit;
    if (uVar1 != 0) {
      segment->readLimiter->limit = uVar1 - 1;
      _::PointerReader::getRoot
                (&local_40,segment,(CapTableReader *)&(anonymous_namespace)::dummyCapTableReader,
                 (segment->ptr).ptr,(this->options).nestingLimit);
      (__return_storage_ptr__->reader).pointer = local_40.pointer;
      (__return_storage_ptr__->reader).nestingLimit = local_40.nestingLimit;
      *(undefined4 *)&(__return_storage_ptr__->reader).field_0x1c = local_40._28_4_;
      (__return_storage_ptr__->reader).segment = local_40.segment;
      (__return_storage_ptr__->reader).capTable = local_40.capTable;
      return __return_storage_ptr__;
    }
    (*segment->arena->_vptr_Arena[3])();
  }
  getRootInternal((MessageReader *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

AnyPointer::Reader MessageReader::getRootInternal() {
  if (!allocatedArena) {
    static_assert(sizeof(_::ReaderArena) <= sizeof(arenaSpace),
        "arenaSpace is too small to hold a ReaderArena.  Please increase it.  This will break "
        "ABI compatibility.");
    kj::ctor(*arena(), this);
    allocatedArena = true;
  }

  _::SegmentReader* segment = arena()->tryGetSegment(_::SegmentId(0));
  KJ_REQUIRE(segment != nullptr &&
             segment->checkObject(segment->getStartPtr(), ONE * WORDS),
             "Message did not contain a root pointer.") {
    return AnyPointer::Reader();
  }

  // const_cast here is safe because dummyCapTableReader has no state.
  return AnyPointer::Reader(_::PointerReader::getRoot(
      segment, const_cast<DummyCapTableReader*>(&dummyCapTableReader),
      segment->getStartPtr(), options.nestingLimit));
}